

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * to_camel_case(string *__return_storage_ptr__,string *text)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  pointer pbVar4;
  pointer pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  string delim;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (text->_M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)text);
  }
  else {
    delim._M_dataplus._M_p = (pointer)&delim.field_2;
    delim._M_string_length = 0;
    delim.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&local_50,(string *)text);
    chooseDelimeter(&local_50,&delim);
    std::__cxx11::string::~string((string *)&local_50);
    if (delim._M_string_length == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)text);
    }
    else {
      lVar3 = std::__cxx11::string::find((string *)text,(ulong)&delim);
      sources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      while (lVar3 != -1) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&sources,
                   &local_70);
        std::__cxx11::string::~string((string *)&local_70);
        lVar3 = std::__cxx11::string::find((string *)text,(ulong)&delim);
      }
      std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&sources,
                 &local_70);
      std::__cxx11::string::~string((string *)&local_70);
      pbVar4 = sources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while (pbVar4 = pbVar4 + 1,
            pbVar4 != sources.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar2 = (pbVar4->_M_dataplus)._M_p;
        cVar1 = *pcVar2;
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          *pcVar2 = cVar1 + -0x20;
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      for (pbVar5 = sources.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar4; pbVar5 = pbVar5 + 1
          ) {
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        pbVar4 = sources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&sources);
    }
    std::__cxx11::string::~string((string *)&delim);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_camel_case(std::string text)
{
	if (text.length() == 0) return text;

	std::string delim;
	chooseDelimeter(text, delim);
	if (delim.empty()) return text;

	size_t start = 0;
	size_t end = text.find(delim);
//	if (end == std::string::npos) return text;
	
	std::vector<std::string> sources;
	while (end != std::string::npos)
	{
		sources.push_back(text.substr(start, end - start));
		start = end + delim.length();
		end = text.find(delim, start);
	}
	sources.push_back(text.substr(start, end));

	for (std::vector<std::string>::iterator it = sources.begin() + 1;
		it != sources.end(); it++)
	{
		if ((*it)[0] > 96 && (*it)[0] < 123)
		{
			(*it)[0] -= 32;
		}
	}

	std::string dest;
	for (std::vector<std::string>::iterator it = sources.begin();
		it != sources.end(); it++)
	{
		dest.append(*it);
	}
	
	return dest;
}